

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

void arith_encode(j_compress_ptr cinfo,uchar *st,int val)

{
  jpeg_entropy_encoder *pjVar1;
  _func_void_j_compress_ptr **pp_Var2;
  byte bVar3;
  jpeg_entropy_encoder *pjVar4;
  int iVar5;
  ulong uVar6;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var7;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var8;
  long lVar9;
  _func_void_j_compress_ptr_boolean *p_Var10;
  
  pjVar4 = cinfo->entropy;
  bVar3 = *st;
  uVar6 = jpeg_aritab[bVar3 & 0x7f];
  p_Var7 = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)((long)uVar6 >> 0x10);
  p_Var8 = pjVar4[1].encode_mcu + -(long)p_Var7;
  pjVar4[1].encode_mcu = p_Var8;
  if ((uint)(bVar3 >> 7) == val) {
    if (0x7fff < (long)p_Var8) {
      return;
    }
    uVar6 = uVar6 >> 8 & 0xffffff;
    if ((long)p_Var7 <= (long)p_Var8) goto LAB_00112875;
  }
  else if ((long)p_Var8 < (long)p_Var7) goto LAB_00112875;
  pjVar4[1].start_pass = (_func_void_j_compress_ptr_boolean *)(p_Var8 + (long)pjVar4[1].start_pass);
  pjVar4[1].encode_mcu = p_Var7;
LAB_00112875:
  *st = bVar3 & 0x80 ^ (byte)uVar6;
  p_Var10 = pjVar4[1].start_pass;
  p_Var7 = pjVar4[1].encode_mcu;
  iVar5 = *(int *)&pjVar4[2].encode_mcu;
  do {
    p_Var7 = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)((long)p_Var7 * 2);
    pjVar4[1].encode_mcu = p_Var7;
    p_Var10 = (_func_void_j_compress_ptr_boolean *)((long)p_Var10 * 2);
    pjVar4[1].start_pass = p_Var10;
    iVar5 = iVar5 + -1;
    *(int *)&pjVar4[2].encode_mcu = iVar5;
    if (iVar5 == 0) {
      lVar9 = (long)p_Var10 >> 0x13;
      if (lVar9 < 0x100) {
        if (lVar9 != 0xff) {
          iVar5 = *(int *)((long)&pjVar4[2].encode_mcu + 4);
          if (iVar5 == 0) {
            pjVar4[2].start_pass = pjVar4[2].start_pass + 1;
          }
          else if (-1 < iVar5) {
            if (pjVar4[2].start_pass != (_func_void_j_compress_ptr_boolean *)0x0) {
              do {
                emit_byte(0,cinfo);
                pjVar1 = pjVar4 + 2;
                pjVar1->start_pass = pjVar1->start_pass + -1;
              } while (pjVar1->start_pass != (_func_void_j_compress_ptr_boolean *)0x0);
              iVar5 = *(int *)((long)&pjVar4[2].encode_mcu + 4);
            }
            emit_byte(iVar5,cinfo);
          }
          if (pjVar4[1].finish_pass != (_func_void_j_compress_ptr *)0x0) {
            p_Var10 = pjVar4[2].start_pass;
            while (p_Var10 != (_func_void_j_compress_ptr_boolean *)0x0) {
              emit_byte(0,cinfo);
              pjVar1 = pjVar4 + 2;
              pjVar1->start_pass = pjVar1->start_pass + -1;
              p_Var10 = pjVar1->start_pass;
            }
            do {
              emit_byte(0xff,cinfo);
              emit_byte(0,cinfo);
              pp_Var2 = &pjVar4[1].finish_pass;
              *pp_Var2 = *pp_Var2 + -1;
            } while (*pp_Var2 != (_func_void_j_compress_ptr *)0x0);
          }
          goto LAB_0011297f;
        }
        pjVar4[1].finish_pass = pjVar4[1].finish_pass + 1;
      }
      else {
        iVar5 = *(int *)((long)&pjVar4[2].encode_mcu + 4);
        if (-1 < iVar5) {
          if (pjVar4[2].start_pass != (_func_void_j_compress_ptr_boolean *)0x0) {
            do {
              emit_byte(0,cinfo);
              pjVar1 = pjVar4 + 2;
              pjVar1->start_pass = pjVar1->start_pass + -1;
            } while (pjVar1->start_pass != (_func_void_j_compress_ptr_boolean *)0x0);
            iVar5 = *(int *)((long)&pjVar4[2].encode_mcu + 4);
          }
          emit_byte(iVar5 + 1,cinfo);
          if (*(int *)((long)&pjVar4[2].encode_mcu + 4) == 0xfe) {
            emit_byte(0,cinfo);
          }
        }
        pjVar4[2].start_pass =
             (_func_void_j_compress_ptr_boolean *)
             (pjVar4[1].finish_pass + (long)pjVar4[2].start_pass);
        pjVar4[1].finish_pass = (_func_void_j_compress_ptr *)0x0;
LAB_0011297f:
        *(uint *)((long)&pjVar4[2].encode_mcu + 4) = (uint)lVar9 & 0xff;
      }
      p_Var7 = pjVar4[1].encode_mcu;
      p_Var10 = (_func_void_j_compress_ptr_boolean *)(ulong)((uint)pjVar4[1].start_pass & 0x7ffff);
      pjVar4[1].start_pass = p_Var10;
      iVar5 = *(int *)&pjVar4[2].encode_mcu + 8;
      *(int *)&pjVar4[2].encode_mcu = iVar5;
    }
    if (0x7fff < (long)p_Var7) {
      return;
    }
  } while( true );
}

Assistant:

LOCAL(void)
arith_encode (j_compress_ptr cinfo, unsigned char *st, int val) 
{
  register arith_entropy_ptr e = (arith_entropy_ptr) cinfo->entropy;
  register unsigned char nl, nm;
  register INT32 qe, temp;
  register int sv;

  /* Fetch values from our compact representation of Table D.3(D.2):
   * Qe values and probability estimation state machine
   */
  sv = *st;
  qe = jpeg_aritab[sv & 0x7F];	/* => Qe_Value */
  nl = qe & 0xFF; qe >>= 8;	/* Next_Index_LPS + Switch_MPS */
  nm = qe & 0xFF; qe >>= 8;	/* Next_Index_MPS */

  /* Encode & estimation procedures per sections D.1.4 & D.1.5 */
  e->a -= qe;
  if (val != (sv >> 7)) {
    /* Encode the less probable symbol */
    if (e->a >= qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency, otherwise code the LPS
       * as usual: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nl;	/* Estimate_after_LPS */
  } else {
    /* Encode the more probable symbol */
    if (e->a >= 0x8000L)
      return;  /* A >= 0x8000 -> ready, no renormalization required */
    if (e->a < qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nm;	/* Estimate_after_MPS */
  }

  /* Renormalization & data output per section D.1.6 */
  do {
    e->a <<= 1;
    e->c <<= 1;
    if (--e->ct == 0) {
      /* Another byte is ready for output */
      temp = e->c >> 19;
      if (temp > 0xFF) {
	/* Handle overflow over all stacked 0xFF bytes */
	if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer + 1, cinfo);
	  if (e->buffer + 1 == 0xFF)
	    emit_byte(0x00, cinfo);
	}
	e->zc += e->sc;  /* carry-over converts stacked 0xFF bytes to 0x00 */
	e->sc = 0;
	/* Note: The 3 spacer bits in the C register guarantee
	 * that the new buffer byte can't be 0xFF here
	 * (see page 160 in the P&M JPEG book). */
	e->buffer = temp & 0xFF;  /* new output byte, might overflow later */
      } else if (temp == 0xFF) {
	++e->sc;  /* stack 0xFF byte (which might overflow later) */
      } else {
	/* Output all stacked 0xFF bytes, they will not overflow any more */
	if (e->buffer == 0)
	  ++e->zc;
	else if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer, cinfo);
	}
	if (e->sc) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  do {
	    emit_byte(0xFF, cinfo);
	    emit_byte(0x00, cinfo);
	  } while (--e->sc);
	}
	e->buffer = temp & 0xFF;  /* new output byte (can still overflow) */
      }
      e->c &= 0x7FFFFL;
      e->ct += 8;
    }
  } while (e->a < 0x8000L);
}